

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O1

void active_print_result(int f,float res,float weight,v_array<char> tag)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  int *piVar4;
  char *__s;
  char temp [30];
  stringstream ss;
  char local_1e8;
  undefined7 uStack_1e7;
  ulong local_1e0;
  undefined1 local_1d8 [16];
  char local_1c8 [32];
  stringstream local_1a8 [16];
  undefined1 local_198 [376];
  
  if (-1 < f) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    sprintf(local_1c8,"%f",SUB84((double)res,0));
    sVar2 = strlen(local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,local_1c8,sVar2);
    iVar1 = print_tag((stringstream *)local_1a8,tag);
    if (iVar1 == 0) {
      local_1e8 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_1e8,1);
    }
    if (0.0 <= weight) {
      sprintf(local_1c8," %f",SUB84((double)weight,0));
      sVar2 = strlen(local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,local_1c8,sVar2);
    }
    local_1e8 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_1e8,1);
    std::__cxx11::stringbuf::str();
    if ((undefined1 *)CONCAT71(uStack_1e7,local_1e8) != local_1d8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1e7,local_1e8));
    }
    std::__cxx11::stringbuf::str();
    uVar3 = io_buf::write_file_or_socket
                      (f,(void *)CONCAT71(uStack_1e7,local_1e8),local_1e0 & 0xffffffff);
    if ((undefined1 *)CONCAT71(uStack_1e7,local_1e8) != local_1d8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1e7,local_1e8));
    }
    if (uVar3 != local_1e0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"write error: ",0xd);
      piVar4 = __errno_location();
      __s = strerror(*piVar4);
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2d1a10);
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  }
  return;
}

Assistant:

void active_print_result(int f, float res, float weight, v_array<char> tag)
{
  if (f >= 0)
  {
    std::stringstream ss;
    char temp[30];
    sprintf(temp, "%f", res);
    ss << temp;
    if (!print_tag(ss, tag))
      ss << ' ';
    if (weight >= 0)
    {
      sprintf(temp, " %f", weight);
      ss << temp;
    }
    ss << '\n';
    ssize_t len = ss.str().size();
    ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
    if (t != len)
      cerr << "write error: " << strerror(errno) << endl;
  }
}